

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void bcemit_nil(FuncState *fs,BCReg from,BCReg n)

{
  BCInsLine *pBVar1;
  char cVar2;
  uint uVar3;
  BCIns local_3c;
  BCReg pfrom;
  BCReg pto;
  BCIns *ip;
  BCReg n_local;
  BCReg from_local;
  FuncState *fs_local;
  
  if (fs->lasttarget < fs->pc) {
    pBVar1 = fs->bcbase + (fs->pc - 1);
    ip._4_4_ = (BCReg)*(byte *)((long)&pBVar1->ins + 1);
    cVar2 = (char)pBVar1->ins;
    if (cVar2 == '+') {
      if (pBVar1->ins >> 0x10 == 0) {
        if (from == ip._4_4_) {
          ip._0_4_ = n;
          ip._4_4_ = from;
          if (n == 1) {
            return;
          }
        }
        else {
          if (from != ip._4_4_ + 1) goto LAB_0012624b;
          ip._0_4_ = n + 1;
        }
        pBVar1->ins = ip._4_4_ << 8 | 0x2c | (ip._4_4_ + (BCReg)ip + -1) * 0x10000;
        return;
      }
    }
    else if (((cVar2 == ',') && (uVar3 = pBVar1->ins >> 0x10, ip._4_4_ <= from)) &&
            (from <= uVar3 + 1)) {
      if ((from + n) - 1 <= uVar3) {
        return;
      }
      *(short *)((long)&pBVar1->ins + 2) = (short)from + (short)n + -1;
      return;
    }
  }
LAB_0012624b:
  if (n == 1) {
    local_3c = from << 8 | 0x2b;
  }
  else {
    local_3c = from << 8 | 0x2c | (from + n + -1) * 0x10000;
  }
  bcemit_INS(fs,local_3c);
  return;
}

Assistant:

static void bcemit_nil(FuncState *fs, BCReg from, BCReg n)
{
  if (fs->pc > fs->lasttarget) {  /* No jumps to current position? */
    BCIns *ip = &fs->bcbase[fs->pc-1].ins;
    BCReg pto, pfrom = bc_a(*ip);
    switch (bc_op(*ip)) {  /* Try to merge with the previous instruction. */
    case BC_KPRI:
      if (bc_d(*ip) != ~LJ_TNIL) break;
      if (from == pfrom) {
	if (n == 1) return;
      } else if (from == pfrom+1) {
	from = pfrom;
	n++;
      } else {
	break;
      }
      *ip = BCINS_AD(BC_KNIL, from, from+n-1);  /* Replace KPRI. */
      return;
    case BC_KNIL:
      pto = bc_d(*ip);
      if (pfrom <= from && from <= pto+1) {  /* Can we connect both ranges? */
	if (from+n-1 > pto)
	  setbc_d(ip, from+n-1);  /* Patch previous instruction range. */
	return;
      }
      break;
    default:
      break;
    }
  }
  /* Emit new instruction or replace old instruction. */
  bcemit_INS(fs, n == 1 ? BCINS_AD(BC_KPRI, from, VKNIL) :
			  BCINS_AD(BC_KNIL, from, from+n-1));
}